

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

string * __thiscall
polyscope::SurfaceMesh::typeName_abi_cxx11_(string *__return_storage_ptr__,SurfaceMesh *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,structureTypeName_abi_cxx11_,
             DAT_005fd708 + structureTypeName_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceMesh::typeName() { return structureTypeName; }